

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber-unix.cpp
# Opt level: O2

void __thiscall
cilk_fiber_sysdep::suspend_self_and_resume_other_sysdep
          (cilk_fiber_sysdep *this,cilk_fiber_sysdep *other)

{
  undefined1 auStack_48 [8];
  cilk_fiber_sysdep *local_40;
  cilk_fiber_sysdep *local_38;
  
  if (((this->super_cilk_fiber).m_flags & 1) == 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber-unix.cpp"
                  ,0x97,"this->is_resumable()");
  }
  this->m_resume_jmpbuf[0] = &stack0xfffffffffffffff8;
  this->m_resume_jmpbuf[2] = auStack_48;
  this->m_resume_jmpbuf[1] = &DAT_0010e826;
  local_40 = this;
  local_38 = other;
  resume_other_sysdep(this,other);
  cilk_fiber::do_post_switch_actions(&this->super_cilk_fiber);
  return;
}

Assistant:

void cilk_fiber_sysdep::suspend_self_and_resume_other_sysdep(cilk_fiber_sysdep* other)
{
#if SUPPORT_GET_CURRENT_FIBER
    cilkos_set_tls_cilk_fiber(other);
#endif
    CILK_ASSERT(this->is_resumable());


    // Jump to the other fiber.  We expect to come back.
    if (! CILK_SETJMP(m_resume_jmpbuf)) {
        resume_other_sysdep(other);
    }

    // Return here when another fiber resumes me.
    // If the fiber that switched to me wants to be deallocated, do it now.
    do_post_switch_actions();
}